

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; ppvVar1 = this->elements_, lVar2 < this->allocated_size_; lVar2 = lVar2 + 1) {
    if ((long *)ppvVar1[lVar2] != (long *)0x0) {
      (**(code **)(*ppvVar1[lVar2] + 8))();
    }
  }
  if (ppvVar1 != (void **)0x0) {
    operator_delete__(ppvVar1);
    return;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  for (int i = 0; i < allocated_size_; i++) {
    TypeHandler::Delete(cast<TypeHandler>(elements_[i]));
  }
  delete [] elements_;
}